

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

QSize __thiscall QMainWindowLayoutState::minimumSize(QMainWindowLayoutState *this)

{
  QSize QVar1;
  long in_FS_OFFSET;
  QSize local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = QDockAreaLayout::minimumSize(&this->dockAreaLayout);
  QVar1 = QToolBarAreaLayout::minimumSize(&this->toolBarAreaLayout,&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

QSize QMainWindowLayoutState::minimumSize() const
{
    QSize result(0, 0);

#if QT_CONFIG(dockwidget)
    result = dockAreaLayout.minimumSize();
#else
    if (centralWidgetItem)
        result = centralWidgetItem->minimumSize();
#endif

#if QT_CONFIG(toolbar)
    result = toolBarAreaLayout.minimumSize(result);
#endif // QT_CONFIG(toolbar)

    return result;
}